

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vk_mem_alloc.h
# Opt level: O1

VkResult vmaCreateAllocator(VmaAllocatorCreateInfo *pCreateInfo,VmaAllocator *pAllocator)

{
  VmaAllocator_T *this;
  
  this = (VmaAllocator_T *)VmaMalloc(pCreateInfo->pAllocationCallbacks,0x1720,8);
  VmaAllocator_T::VmaAllocator_T(this,pCreateInfo);
  *pAllocator = this;
  if (this->m_UseExtMemoryBudget == true) {
    VmaAllocator_T::UpdateVulkanBudget(this);
  }
  return VK_SUCCESS;
}

Assistant:

VMA_CALL_PRE VkResult VMA_CALL_POST vmaCreateAllocator(
    const VmaAllocatorCreateInfo* pCreateInfo,
    VmaAllocator* pAllocator)
{
    VMA_ASSERT(pCreateInfo && pAllocator);
    VMA_ASSERT(pCreateInfo->vulkanApiVersion == 0 ||
        (VK_VERSION_MAJOR(pCreateInfo->vulkanApiVersion) == 1 && VK_VERSION_MINOR(pCreateInfo->vulkanApiVersion) <= 3));
    VMA_DEBUG_LOG("vmaCreateAllocator");
    *pAllocator = vma_new(pCreateInfo->pAllocationCallbacks, VmaAllocator_T)(pCreateInfo);
    VkResult result = (*pAllocator)->Init(pCreateInfo);
    if(result < 0)
    {
        vma_delete(pCreateInfo->pAllocationCallbacks, *pAllocator);
        *pAllocator = VK_NULL_HANDLE;
    }
    return result;
}